

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred.c
# Opt level: O2

void ihevc_weighted_pred_chroma_bi
               (WORD16 *pi2_src1,WORD16 *pi2_src2,UWORD8 *pu1_dst,WORD32 src_strd1,WORD32 src_strd2,
               WORD32 dst_strd,WORD32 wgt0_cb,WORD32 wgt0_cr,WORD32 off0_cb,WORD32 off0_cr,
               WORD32 wgt1_cb,WORD32 wgt1_cr,WORD32 off1_cb,WORD32 off1_cr,WORD32 shift,
               WORD32 lvl_shift1,WORD32 lvl_shift2,WORD32 ht,WORD32 wd)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  bVar1 = (byte)shift;
  if (ht < 1) {
    ht = 0;
  }
  for (iVar3 = 0; iVar3 != ht; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; lVar4 < wd * 2; lVar4 = lVar4 + 2) {
      iVar2 = (pi2_src2[lVar4] + lvl_shift2) * wgt1_cb +
              (pi2_src1[lVar4] + lvl_shift1) * wgt0_cb +
              (off0_cb + off1_cb + 1 << (bVar1 - 1 & 0x1f));
      if (iVar2 >> (bVar1 & 0x1f) < 1) {
        iVar2 = 0;
      }
      iVar2 = iVar2 >> (bVar1 & 0x1f);
      if (0xfe < iVar2) {
        iVar2 = 0xff;
      }
      pu1_dst[lVar4] = (UWORD8)iVar2;
      iVar2 = (pi2_src2[lVar4 + 1] + lvl_shift2) * wgt1_cr +
              (pi2_src1[lVar4 + 1] + lvl_shift1) * wgt0_cr +
              (off0_cr + off1_cr + 1 << (bVar1 - 1 & 0x1f));
      if (iVar2 >> (bVar1 & 0x1f) < 1) {
        iVar2 = 0;
      }
      iVar2 = iVar2 >> (bVar1 & 0x1f);
      if (0xfe < iVar2) {
        iVar2 = 0xff;
      }
      pu1_dst[lVar4 + 1] = (UWORD8)iVar2;
    }
    pu1_dst = pu1_dst + dst_strd;
    pi2_src2 = pi2_src2 + src_strd2;
    pi2_src1 = pi2_src1 + src_strd1;
  }
  return;
}

Assistant:

void ihevc_weighted_pred_chroma_bi(WORD16 *pi2_src1,
                                   WORD16 *pi2_src2,
                                   UWORD8 *pu1_dst,
                                   WORD32 src_strd1,
                                   WORD32 src_strd2,
                                   WORD32 dst_strd,
                                   WORD32 wgt0_cb,
                                   WORD32 wgt0_cr,
                                   WORD32 off0_cb,
                                   WORD32 off0_cr,
                                   WORD32 wgt1_cb,
                                   WORD32 wgt1_cr,
                                   WORD32 off1_cb,
                                   WORD32 off1_cr,
                                   WORD32 shift,
                                   WORD32 lvl_shift1,
                                   WORD32 lvl_shift2,
                                   WORD32 ht,
                                   WORD32 wd)
{
    WORD32 row, col;
    WORD32 i4_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col += 2)
        {
            i4_tmp = (pi2_src1[col] + lvl_shift1) * wgt0_cb;
            i4_tmp += (pi2_src2[col] + lvl_shift2) * wgt1_cb;
            i4_tmp += (off0_cb + off1_cb + 1) << (shift - 1);

            pu1_dst[col] = CLIP_U8(i4_tmp >> shift);

            i4_tmp = (pi2_src1[col + 1] + lvl_shift1) * wgt0_cr;
            i4_tmp += (pi2_src2[col + 1] + lvl_shift2) * wgt1_cr;
            i4_tmp += (off0_cr + off1_cr + 1) << (shift - 1);

            pu1_dst[col + 1] = CLIP_U8(i4_tmp >> shift);
        }

        pi2_src1 += src_strd1;
        pi2_src2 += src_strd2;
        pu1_dst += dst_strd;
    }
}